

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *pcVar4;
  char *extraout_RDX_04;
  int iVar5;
  byte *pbVar6;
  long lStack_40;
  
  if (ptr == end) {
    return -4;
  }
  iVar5 = 0;
  iVar3 = 0;
  pcVar4 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    goto switchD_00153ddb_caseD_0;
  default:
    pbVar6 = (byte *)(ptr + 1);
    break;
  case 4:
    pbVar6 = (byte *)(ptr + 1);
    if (pbVar6 == (byte *)end) {
      return -1;
    }
    if (*pbVar6 == 0x5d) {
      if (ptr + 2 == end) {
        return -1;
      }
      if (ptr[2] == '>') {
        ptr = ptr + 3;
        iVar3 = 0x28;
        goto switchD_00153ddb_caseD_0;
      }
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar2 = (*enc[3].scanners[2])(enc,ptr,end,(char **)&switchD_00153ddb::switchdataD_001cd85c);
    iVar3 = iVar5;
    if (iVar2 != 0) goto switchD_00153ddb_caseD_0;
    pbVar6 = (byte *)(ptr + 2);
    pcVar4 = extraout_RDX_04;
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar2 = (*enc[3].scanners[3])(enc,ptr,end,(char **)&switchD_00153ddb::switchdataD_001cd85c);
    iVar3 = iVar5;
    if (iVar2 != 0) goto switchD_00153ddb_caseD_0;
    pbVar6 = (byte *)(ptr + 3);
    pcVar4 = extraout_RDX;
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar2 = (*enc[3].literalScanners[0])
                      (enc,ptr,end,(char **)&switchD_00153ddb::switchdataD_001cd85c);
    iVar3 = iVar5;
    if (iVar2 != 0) goto switchD_00153ddb_caseD_0;
    pbVar6 = (byte *)(ptr + 4);
    pcVar4 = extraout_RDX_00;
    break;
  case 9:
    pbVar6 = (byte *)(ptr + 1);
    if (pbVar6 == (byte *)end) {
      return -1;
    }
    pbVar1 = (byte *)(ptr + 1);
    ptr = ptr + 2;
    if (*(char *)((long)enc[1].scanners + (ulong)*pbVar1) != '\n') {
      ptr = (char *)pbVar6;
    }
    goto LAB_00153eac;
  case 10:
    ptr = ptr + 1;
LAB_00153eac:
    iVar3 = 7;
    goto switchD_00153ddb_caseD_0;
  }
  for (; pbVar6 != (byte *)end; pbVar6 = pbVar6 + lStack_40) {
    lStack_40 = 1;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar6)) {
    case 0:
    case 1:
    case 4:
    case 8:
    case 9:
    case 10:
      goto switchD_00153ef8_caseD_0;
    default:
      goto switchD_00153ef8_caseD_2;
    case 5:
      if ((long)end - (long)pbVar6 < 2) goto switchD_00153ef8_caseD_0;
      iVar3 = (*enc[3].scanners[2])(enc,(char *)pbVar6,pcVar4,(char **)0x1);
      lStack_40 = 2;
      pcVar4 = extraout_RDX_01;
      break;
    case 6:
      if ((long)end - (long)pbVar6 < 3) goto switchD_00153ef8_caseD_0;
      iVar3 = (*enc[3].scanners[3])(enc,(char *)pbVar6,pcVar4,(char **)0x1);
      lStack_40 = 3;
      pcVar4 = extraout_RDX_02;
      break;
    case 7:
      if ((long)end - (long)pbVar6 < 4) goto switchD_00153ef8_caseD_0;
      iVar3 = (*enc[3].literalScanners[0])(enc,(char *)pbVar6,pcVar4,(char **)0x1);
      lStack_40 = 4;
      pcVar4 = extraout_RDX_03;
    }
    if (iVar3 != 0) break;
switchD_00153ef8_caseD_2:
  }
switchD_00153ef8_caseD_0:
  ptr = (char *)pbVar6;
  iVar3 = 6;
switchD_00153ddb_caseD_0:
  *nextTokPtr = ptr;
  return iVar3;
}

Assistant:

static
int PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                            const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}